

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void initScene(scene_t *scene)

{
  GLuint *pGVar1;
  undefined8 *puVar2;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  bool bVar6;
  byte *pbVar7;
  yo_env *pyVar8;
  int *piVar9;
  float *pfVar10;
  float *pfVar11;
  yo__vec2f yVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  void *__n_00;
  yo__vert vl;
  yo__vert v_00;
  yo__vert vl_00;
  yo__vert v_01;
  yo__vert vl_01;
  yo__vert v_02;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  char **vp;
  string sVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  GLuint GVar27;
  GLint GVar28;
  char *p;
  yo_scene *scene_00;
  yo__vhash *vhash;
  yo_shape *pyVar29;
  FILE *__stream;
  char *pcVar30;
  char *pcVar31;
  char ***pppcVar32;
  yo_scene *pyVar33;
  yo__vec3f *pos;
  long lVar34;
  yo_camera *pyVar35;
  yo_material *pyVar36;
  yo_texture *pyVar37;
  vec3f *positions;
  void *pvVar38;
  vec3f *normal;
  void *__src;
  int *piVar39;
  int *sphcnt;
  float *LHbuffer;
  void *pvVar40;
  long *plVar41;
  long lVar42;
  long *plVar43;
  size_type *psVar44;
  char **ppcVar45;
  uint uVar46;
  uint uVar47;
  char *pcVar48;
  byte *pbVar49;
  ulong uVar50;
  long lVar51;
  uint uVar52;
  int iVar53;
  size_t sVar54;
  yo__vec3f *in_R8;
  float *in_R9;
  byte bVar55;
  int t;
  uint uVar56;
  undefined8 *puVar57;
  long lVar58;
  ulong uVar59;
  int j;
  undefined4 uVar60;
  byte *pbVar61;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  yo__vert v;
  string __str_1;
  yo__vert v_2;
  yo__vert v_1;
  string __str_2;
  SphereTree hierarchy;
  string vert_head;
  string N_ZEROS;
  yo_texture *local_4218;
  ulong local_4208;
  yo__vec3f *local_41e8;
  yo__vec2f *local_41e0;
  undefined1 local_41d8 [16];
  undefined4 *local_41a8;
  uint uStack_41a0;
  undefined4 uStack_419c;
  undefined4 uStack_4198;
  undefined4 uStack_4194;
  long lStack_4190;
  int *local_4188 [2];
  int local_4178;
  int iStack_4174;
  undefined8 uStack_4170;
  undefined4 *local_4168;
  uint uStack_4160;
  undefined4 uStack_415c;
  undefined4 uStack_4158;
  undefined4 uStack_4154;
  string local_4148;
  undefined4 *local_4128;
  uint uStack_4120;
  undefined4 uStack_411c;
  undefined4 uStack_4118;
  undefined4 uStack_4114;
  long lStack_4110;
  yo__vert local_4108;
  long lStack_40f0;
  ulong *local_40e8;
  long local_40e0;
  ulong local_40d8 [2];
  string local_40c8;
  int *local_40a8;
  int *local_40a0;
  int *local_4098;
  int *local_4090;
  int *local_4088;
  int *local_4080;
  int *local_4078;
  int *local_4070;
  SphereTree local_4060;
  undefined8 local_4038;
  long local_4030;
  long local_4028;
  long lStack_4020;
  char **local_3038;
  char *pcStack_3030;
  char *local_3028;
  char *pcStack_3020;
  char *local_3018;
  char *pcStack_3010;
  char *local_3008;
  char *local_3000;
  char *local_2ff8;
  char *local_2ff0;
  char *pcStack_2fe8;
  char *local_2fe0;
  undefined8 local_2038;
  char *apcStack_2030 [4];
  char *pcStack_2010;
  char *local_2008;
  char *pcStack_2000;
  char *local_1ff8;
  char *pcStack_1ff0;
  
  load_sphere_hierarchy(&local_4060,"../res/scene1/scene1.sph");
  buildLHcubemap("../res/null.shrgb");
  loadlut(3,&(scene->mesh).max_magn);
  build_sh_lut();
  iVar20 = upload_gamma(0xf);
  (scene->mesh).gammasize = iVar20;
  iVar20 = upload_sqrgamma(0xf);
  (scene->mesh).sqrgammasize = iVar20;
  github111116::ConsoleLogger::log<char[12],int>
            (&console,(char (*) [12])0x19916d,&(scene->mesh).gammasize);
  github111116::ConsoleLogger::log<char[15],int>
            (&console,(char (*) [15])"sqrgamma size:",&(scene->mesh).sqrgammasize);
  github111116::ConsoleLogger::log<char[17]>(&console,(char (*) [17])"loading scene...");
  scene_00 = (yo_scene *)calloc(1,0x50);
  vhash = (yo__vhash *)calloc(1,0xc00008);
  pyVar29 = (yo_shape *)calloc(1,0x60);
  scene_00->shapes = pyVar29;
  scene_00->nshapes = 1;
  __stream = fopen("../res/scene1/scene1.obj","rt");
  if (__stream == (FILE *)0x0) {
LAB_0015e358:
    puVar57 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar57 = "Error loading obj file";
    __cxa_throw(puVar57,&char_const*::typeinfo,0);
  }
  pcVar30 = fgets((char *)&local_4038,0x1000,__stream);
  if (pcVar30 == (char *)0x0) {
    local_41e0 = (yo__vec2f *)0x0;
    local_41e8 = (yo__vec3f *)0x0;
    pos = (yo__vec3f *)0x0;
  }
  else {
    local_4218 = (yo_texture *)0x0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_41d8._8_8_;
    local_41d8 = auVar16 << 0x40;
    local_4208 = 0;
    pos = (yo__vec3f *)0x0;
    local_41e8 = (yo__vec3f *)0x0;
    local_41e0 = (yo__vec2f *)0x0;
    do {
      puVar57 = &local_4038;
      if (local_4038._0_1_ == (string)0x0) goto LAB_0015ca76;
      uVar25 = 0;
      sVar19 = local_4038._0_1_;
      do {
        iVar20 = isspace((int)(char)sVar19);
        if (iVar20 == 0) {
          if ((uVar25 == 0) || (*(char *)((long)puVar57 + -1) == '\0')) {
            (&local_2038)[(int)uVar25] = puVar57;
            uVar25 = uVar25 + 1;
          }
        }
        else {
          *(undefined1 *)puVar57 = 0;
        }
        pcVar31 = apcStack_2030[1];
        pcVar30 = (char *)local_2038;
        sVar19 = *(string *)((long)puVar57 + 1);
      } while ((sVar19 != (string)0x0) &&
              (puVar57 = (undefined8 *)((long)puVar57 + 1), (int)uVar25 < 0x400));
      if (uVar25 == 0) goto LAB_0015ca76;
      uVar56 = local_41d8._0_4_;
      uVar47 = (uint)local_4208;
      uVar26 = (uint)local_4218;
      switch(*(char *)local_2038) {
      case 'c':
      case 'e':
        cVar5 = *(char *)((long)local_2038 + 1);
joined_r0x0015c919:
        if (cVar5 != '\0') break;
        goto LAB_0015ca76;
      case 'd':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'm':
      case 'n':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'w':
        break;
      case 'f':
        if (*(char *)((long)local_2038 + 1) == '\0') {
          if (pyVar29->etype != 3) {
            pyVar29 = yo__flush_shape(scene_00,vhash);
          }
          pyVar29->etype = 3;
          if (1 < (int)uVar25) {
            uVar50 = 1;
            iVar20 = 0;
            do {
              local_4128 = (undefined4 *)CONCAT44(uVar56,uVar26);
              uStack_411c = 0;
              uStack_4118 = 0;
              uStack_4114 = 0;
              vl_01.norm = (undefined4)local_4208;
              vl_01.color = local_4208._4_4_;
              vl_01._0_8_ = local_4128;
              vl_01.radius = 0;
              vl_01.vid = 0;
              uStack_4120 = uVar47;
              yo__parse_vert((yo__vert *)&local_4148,(char *)(&local_2038)[uVar50],vhash,vl_01);
              v_02.norm = (undefined4)local_4148._M_string_length;
              v_02.color = local_4148._M_string_length._4_4_;
              v_02._0_8_ = local_4148._M_dataplus._M_p;
              v_02.radius = local_4148.field_2._M_allocated_capacity._0_4_;
              v_02.vid = local_4148.field_2._M_allocated_capacity._4_4_;
              yo__add_shape_vert(pyVar29,v_02,pos,local_41e8,local_41e0,in_R8,in_R9);
              uVar18 = local_4148.field_2._M_allocated_capacity._4_4_;
              uVar60 = iVar20;
              if (uVar50 == 1) {
                uVar60 = local_4148.field_2._M_allocated_capacity._4_4_;
              }
              uVar46 = pyVar29->nelems;
              if (3 < uVar50) {
                lVar34 = (long)(int)uVar46;
                piVar39 = pyVar29->elem;
                iVar53 = piVar39[lVar34 + -1];
                if (uVar46 == 0xffffffff) {
                  iVar24 = 0;
LAB_0015c5bd:
                  uVar21 = uVar46 - 1 >> 1 | uVar46 - 1;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  uVar21 = (uVar21 >> 0x10 | uVar21) + 1;
                  in_R8 = (yo__vec3f *)(ulong)uVar21;
                  if ((int)uVar21 < iVar24) {
                    if (uVar46 != 0xffffffff) goto LAB_0015c600;
                    sVar54 = 0;
                    goto LAB_0015c62b;
                  }
                }
                else {
                  if (uVar46 != 0) {
                    uVar21 = uVar46 >> 1 | uVar46;
                    uVar21 = uVar21 >> 2 | uVar21;
                    uVar21 = uVar21 >> 4 | uVar21;
                    uVar21 = uVar21 >> 8 | uVar21;
                    iVar24 = (uVar21 >> 0x10 | uVar21) + 1;
                    goto LAB_0015c5bd;
                  }
LAB_0015c600:
                  uVar46 = uVar46 >> 1 | uVar46;
                  uVar46 = uVar46 >> 2 | uVar46;
                  uVar46 = uVar46 >> 4 | uVar46;
                  uVar46 = uVar46 >> 8 | uVar46;
                  sVar54 = (long)(int)((uVar46 >> 0x10 | uVar46) + 1) << 2;
LAB_0015c62b:
                  piVar39 = (int *)realloc(piVar39,sVar54);
                  pyVar29->elem = piVar39;
                  lVar34 = (long)pyVar29->nelems;
                }
                piVar39[lVar34] = iVar20;
                uVar46 = pyVar29->nelems;
                uVar21 = uVar46 + 1;
                pyVar29->nelems = uVar21;
                if (uVar21 == 0) {
LAB_0015c64d:
                  uVar21 = uVar21 >> 1 | uVar21;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  sVar54 = (long)(int)((uVar21 >> 0x10 | uVar21) + 1) << 2;
LAB_0015c678:
                  piVar39 = (int *)realloc(piVar39,sVar54);
                  pyVar29->elem = piVar39;
                  uVar21 = pyVar29->nelems;
                }
                else {
                  iVar20 = 0;
                  if (uVar46 != 0xfffffffe) {
                    uVar52 = uVar21 >> 1 | uVar21;
                    uVar52 = uVar52 >> 2 | uVar52;
                    uVar52 = uVar52 >> 4 | uVar52;
                    uVar52 = uVar52 >> 8 | uVar52;
                    iVar20 = (uVar52 >> 0x10 | uVar52) + 1;
                  }
                  uVar52 = uVar46 >> 1 | uVar46;
                  uVar52 = uVar52 >> 2 | uVar52;
                  uVar52 = uVar52 >> 4 | uVar52;
                  uVar52 = uVar52 >> 8 | uVar52;
                  in_R8 = (yo__vec3f *)(ulong)uVar52;
                  if ((int)((uVar52 >> 0x10 | uVar52) + 1) < iVar20) {
                    if (uVar46 != 0xfffffffe) goto LAB_0015c64d;
                    sVar54 = 0;
                    goto LAB_0015c678;
                  }
                }
                piVar39[(int)uVar21] = iVar53;
                uVar46 = pyVar29->nelems + 1;
                pyVar29->nelems = uVar46;
              }
              if (uVar46 == 0xffffffff) {
                iVar20 = 0;
LAB_0015c741:
                uVar21 = uVar46 - 1 >> 1 | uVar46 - 1;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                piVar39 = pyVar29->elem;
                if ((int)((uVar21 >> 0x10 | uVar21) + 1) < iVar20) {
                  if (uVar46 != 0xffffffff) goto LAB_0015c775;
                  sVar54 = 0;
                  goto LAB_0015c7a0;
                }
              }
              else {
                if (uVar46 != 0) {
                  uVar21 = uVar46 >> 1 | uVar46;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  iVar20 = (uVar21 >> 0x10 | uVar21) + 1;
                  goto LAB_0015c741;
                }
                piVar39 = pyVar29->elem;
LAB_0015c775:
                uVar46 = uVar46 >> 1 | uVar46;
                uVar46 = uVar46 >> 2 | uVar46;
                uVar46 = uVar46 >> 4 | uVar46;
                uVar46 = uVar46 >> 8 | uVar46;
                sVar54 = (long)(int)((uVar46 >> 0x10 | uVar46) + 1) << 2;
LAB_0015c7a0:
                piVar39 = (int *)realloc(piVar39,sVar54);
                pyVar29->elem = piVar39;
                uVar46 = pyVar29->nelems;
              }
              piVar39[(int)uVar46] = uVar18;
              pyVar29->nelems = pyVar29->nelems + 1;
              uVar50 = uVar50 + 1;
              iVar20 = uVar60;
            } while (uVar25 != uVar50);
          }
          goto LAB_0015ca76;
        }
        break;
      case 'g':
        if (*(char *)((long)local_2038 + 1) == '\0') {
          pyVar29 = yo__flush_shape(scene_00,vhash);
          pcVar30 = apcStack_2030[0];
          if (apcStack_2030[0] == (char *)0x0 || (int)uVar25 < 2) {
            pcVar31 = (char *)0x0;
          }
          else {
            sVar54 = strlen(apcStack_2030[0]);
            pcVar31 = (char *)calloc(sVar54 + 1,1);
            strcpy(pcVar31,pcVar30);
          }
          pyVar29->groupname = pcVar31;
          goto LAB_0015ca76;
        }
        break;
      case 'l':
        if (*(char *)((long)local_2038 + 1) == '\0') {
          if (pyVar29->etype != 2) {
            pyVar29 = yo__flush_shape(scene_00,vhash);
          }
          pyVar29->etype = 2;
          if (1 < (int)uVar25) {
            uVar50 = 1;
            do {
              local_41a8 = (undefined4 *)CONCAT44(uVar56,uVar26);
              uStack_419c = 0;
              uStack_4198 = 0;
              uStack_4194 = 0;
              vl.norm = (undefined4)local_4208;
              vl.color = local_4208._4_4_;
              vl._0_8_ = local_41a8;
              vl.radius = 0;
              vl.vid = 0;
              uStack_41a0 = uVar47;
              yo__parse_vert((yo__vert *)local_4188,(char *)(&local_2038)[uVar50],vhash,vl);
              v_00._8_8_ = local_4188[1];
              v_00._0_8_ = local_4188[0];
              v_00.radius = local_4178;
              v_00.vid = iStack_4174;
              yo__add_shape_vert(pyVar29,v_00,pos,local_41e8,local_41e0,in_R8,in_R9);
              uVar46 = pyVar29->nelems;
              if (2 < uVar50) {
                lVar34 = (long)(int)uVar46;
                piVar39 = pyVar29->elem;
                iVar20 = piVar39[lVar34 + -1];
                if (uVar46 == 0xffffffff) {
                  iVar53 = 0;
LAB_0015c15f:
                  uVar21 = uVar46 - 1 >> 1 | uVar46 - 1;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  uVar21 = (uVar21 >> 0x10 | uVar21) + 1;
                  in_R8 = (yo__vec3f *)(ulong)uVar21;
                  if ((int)uVar21 < iVar53) {
                    if (uVar46 != 0xffffffff) goto LAB_0015c1a2;
                    sVar54 = 0;
                    goto LAB_0015c1cd;
                  }
                }
                else {
                  if (uVar46 != 0) {
                    uVar21 = uVar46 >> 1 | uVar46;
                    uVar21 = uVar21 >> 2 | uVar21;
                    uVar21 = uVar21 >> 4 | uVar21;
                    uVar21 = uVar21 >> 8 | uVar21;
                    iVar53 = (uVar21 >> 0x10 | uVar21) + 1;
                    goto LAB_0015c15f;
                  }
LAB_0015c1a2:
                  uVar46 = uVar46 >> 1 | uVar46;
                  uVar46 = uVar46 >> 2 | uVar46;
                  uVar46 = uVar46 >> 4 | uVar46;
                  uVar46 = uVar46 >> 8 | uVar46;
                  sVar54 = (long)(int)((uVar46 >> 0x10 | uVar46) + 1) << 2;
LAB_0015c1cd:
                  piVar39 = (int *)realloc(piVar39,sVar54);
                  pyVar29->elem = piVar39;
                  lVar34 = (long)pyVar29->nelems;
                }
                piVar39[lVar34] = iVar20;
                uVar46 = pyVar29->nelems + 1;
                pyVar29->nelems = uVar46;
              }
              if (uVar46 == 0xffffffff) {
                iVar20 = 0;
LAB_0015c229:
                uVar21 = uVar46 - 1 >> 1 | uVar46 - 1;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                piVar39 = pyVar29->elem;
                if ((int)((uVar21 >> 0x10 | uVar21) + 1) < iVar20) {
                  if (uVar46 != 0xffffffff) goto LAB_0015c25d;
                  sVar54 = 0;
                  goto LAB_0015c288;
                }
              }
              else {
                if (uVar46 != 0) {
                  uVar21 = uVar46 >> 1 | uVar46;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  iVar20 = (uVar21 >> 0x10 | uVar21) + 1;
                  goto LAB_0015c229;
                }
                piVar39 = pyVar29->elem;
LAB_0015c25d:
                uVar46 = uVar46 >> 1 | uVar46;
                uVar46 = uVar46 >> 2 | uVar46;
                uVar46 = uVar46 >> 4 | uVar46;
                uVar46 = uVar46 >> 8 | uVar46;
                sVar54 = (long)(int)((uVar46 >> 0x10 | uVar46) + 1) << 2;
LAB_0015c288:
                piVar39 = (int *)realloc(piVar39,sVar54);
                pyVar29->elem = piVar39;
                uVar46 = pyVar29->nelems;
              }
              piVar39[(int)uVar46] = iStack_4174;
              pyVar29->nelems = pyVar29->nelems + 1;
              uVar50 = uVar50 + 1;
            } while (uVar25 != uVar50);
          }
          goto LAB_0015ca76;
        }
        break;
      case 'o':
        if (*(char *)((long)local_2038 + 1) == '\0') {
          pyVar29 = yo__flush_shape(scene_00,vhash);
          pcVar30 = apcStack_2030[0];
          if (apcStack_2030[0] == (char *)0x0 || (int)uVar25 < 2) {
            pcVar31 = (char *)0x0;
          }
          else {
            sVar54 = strlen(apcStack_2030[0]);
            pcVar31 = (char *)calloc(sVar54 + 1,1);
            strcpy(pcVar31,pcVar30);
          }
          pyVar29->name = pcVar31;
          goto LAB_0015ca76;
        }
        break;
      case 'p':
        if (*(char *)((long)local_2038 + 1) == '\0') {
          if (pyVar29->etype != 1) {
            pyVar29 = yo__flush_shape(scene_00,vhash);
          }
          pyVar29->etype = 1;
          if (1 < (int)uVar25) {
            uVar50 = 1;
            do {
              local_4168 = (undefined4 *)CONCAT44(uVar56,uVar26);
              uStack_415c = 0;
              uStack_4158 = 0;
              uStack_4154 = 0;
              vl_00.norm = (undefined4)local_4208;
              vl_00.color = local_4208._4_4_;
              vl_00._0_8_ = local_4168;
              vl_00.radius = 0;
              vl_00.vid = 0;
              uStack_4160 = uVar47;
              yo__parse_vert(&local_4108,(char *)(&local_2038)[uVar50],vhash,vl_00);
              v_01.norm = local_4108.norm;
              v_01.color = local_4108.color;
              v_01.pos = local_4108.pos;
              v_01.texcoord = local_4108.texcoord;
              v_01.radius = local_4108.radius;
              v_01.vid = local_4108.vid;
              yo__add_shape_vert(pyVar29,v_01,pos,local_41e8,local_41e0,in_R8,in_R9);
              uVar46 = pyVar29->nelems;
              if (uVar46 == 0xffffffff) {
                iVar20 = 0;
LAB_0015c3e4:
                uVar21 = uVar46 - 1 >> 1 | uVar46 - 1;
                uVar21 = uVar21 >> 2 | uVar21;
                uVar21 = uVar21 >> 4 | uVar21;
                uVar21 = uVar21 >> 8 | uVar21;
                piVar39 = pyVar29->elem;
                if ((int)((uVar21 >> 0x10 | uVar21) + 1) < iVar20) {
                  if (uVar46 != 0xffffffff) goto LAB_0015c418;
                  sVar54 = 0;
                  goto LAB_0015c443;
                }
              }
              else {
                if (uVar46 != 0) {
                  uVar21 = uVar46 >> 1 | uVar46;
                  uVar21 = uVar21 >> 2 | uVar21;
                  uVar21 = uVar21 >> 4 | uVar21;
                  uVar21 = uVar21 >> 8 | uVar21;
                  iVar20 = (uVar21 >> 0x10 | uVar21) + 1;
                  goto LAB_0015c3e4;
                }
                piVar39 = pyVar29->elem;
LAB_0015c418:
                uVar46 = uVar46 >> 1 | uVar46;
                uVar46 = uVar46 >> 2 | uVar46;
                uVar46 = uVar46 >> 4 | uVar46;
                uVar46 = uVar46 >> 8 | uVar46;
                sVar54 = (long)(int)((uVar46 >> 0x10 | uVar46) + 1) << 2;
LAB_0015c443:
                piVar39 = (int *)realloc(piVar39,sVar54);
                pyVar29->elem = piVar39;
                uVar46 = pyVar29->nelems;
              }
              piVar39[(int)uVar46] = local_4108.vid;
              pyVar29->nelems = pyVar29->nelems + 1;
              uVar50 = uVar50 + 1;
            } while (uVar25 != uVar50);
          }
          goto LAB_0015ca76;
        }
        break;
      case 'v':
        bVar55 = *(byte *)((long)local_2038 + 1);
        if (0x6d < bVar55) {
          if (bVar55 != 0x6e) {
            if (bVar55 == 0x72) goto LAB_0015c915;
            if ((bVar55 != 0x74) || (*(char *)((long)local_2038 + 2) != '\0')) break;
            dVar13 = atof(apcStack_2030[0]);
            dVar14 = atof(pcVar31);
            if (uVar56 == 0xffffffff) {
              iVar20 = 0;
LAB_0015cd95:
              uVar25 = uVar56 - 1 >> 1 | uVar56 - 1;
              uVar25 = uVar25 >> 2 | uVar25;
              uVar25 = uVar25 >> 4 | uVar25;
              uVar25 = uVar25 >> 8 | uVar25;
              if ((int)((uVar25 >> 0x10 | uVar25) + 1) < iVar20) {
                if (uVar56 != 0xffffffff) goto LAB_0015cdcf;
                sVar54 = 0;
                goto LAB_0015ce05;
              }
            }
            else {
              if (uVar56 != 0) {
                uVar25 = (uint)((ulong)local_41d8._0_8_ >> 1) & 0x7fffffff | uVar56;
                uVar25 = uVar25 >> 2 | uVar25;
                uVar25 = uVar25 >> 4 | uVar25;
                uVar25 = uVar25 >> 8 | uVar25;
                iVar20 = (uVar25 >> 0x10 | uVar25) + 1;
                goto LAB_0015cd95;
              }
LAB_0015cdcf:
              uVar25 = (uint)((ulong)local_41d8._0_8_ >> 1) & 0x7fffffff | uVar56;
              uVar25 = uVar25 >> 2 | uVar25;
              uVar25 = uVar25 >> 4 | uVar25;
              uVar25 = uVar25 >> 8 | uVar25;
              sVar54 = (long)(int)((uVar25 >> 0x10 | uVar25) + 1) << 3;
LAB_0015ce05:
              local_41d8._8_4_ = extraout_XMM0_Dc;
              local_41d8._0_8_ = dVar14;
              local_41d8._12_4_ = extraout_XMM0_Dd;
              local_41e0 = (yo__vec2f *)realloc(local_41e0,sVar54);
            }
            yVar12.y = (float)dVar14;
            yVar12.x = (float)dVar13;
            local_41e0[(int)uVar56] = yVar12;
            local_41d8._4_4_ = 0;
            local_41d8._0_4_ = uVar56 + 1;
            goto LAB_0015ca76;
          }
          if (*(char *)((long)local_2038 + 2) != '\0') break;
          dVar13 = atof(apcStack_2030[0]);
          dVar14 = atof(apcStack_2030[1]);
          dVar15 = atof(apcStack_2030[2]);
          if (uVar47 == 0xffffffff) {
            iVar20 = 0;
LAB_0015cd04:
            uVar25 = uVar47 - 1 >> 1 | uVar47 - 1;
            uVar25 = uVar25 >> 2 | uVar25;
            uVar25 = uVar25 >> 4 | uVar25;
            uVar25 = uVar25 >> 8 | uVar25;
            if ((int)((uVar25 >> 0x10 | uVar25) + 1) < iVar20) {
              if (uVar47 != 0xffffffff) goto LAB_0015cd3c;
              sVar54 = 0;
              goto LAB_0015cd70;
            }
          }
          else {
            if (uVar47 != 0) {
              uVar25 = (uint)(local_4208 >> 1) | uVar47;
              uVar25 = uVar25 >> 2 | uVar25;
              uVar25 = uVar25 >> 4 | uVar25;
              uVar25 = uVar25 >> 8 | uVar25;
              iVar20 = (uVar25 >> 0x10 | uVar25) + 1;
              goto LAB_0015cd04;
            }
LAB_0015cd3c:
            uVar25 = (uint)(local_4208 >> 1) | uVar47;
            uVar25 = uVar25 >> 2 | uVar25;
            uVar25 = uVar25 >> 4 | uVar25;
            uVar25 = uVar25 >> 8 | uVar25;
            sVar54 = (long)(int)((uVar25 >> 0x10 | uVar25) + 1) * 0xc;
LAB_0015cd70:
            local_41e8 = (yo__vec3f *)realloc(local_41e8,sVar54);
          }
          local_41e8[(int)uVar47].x = (float)dVar13;
          local_41e8[(int)uVar47].y = (float)dVar14;
          local_41e8[(int)uVar47].z = (float)dVar15;
          local_4208 = (ulong)(uVar47 + 1);
          goto LAB_0015ca76;
        }
        if (bVar55 != 0) {
          if (bVar55 == 99) goto LAB_0015c915;
          break;
        }
        dVar13 = atof(apcStack_2030[0]);
        dVar14 = atof(apcStack_2030[1]);
        dVar15 = atof(apcStack_2030[2]);
        if (uVar26 == 0xffffffff) {
          iVar20 = 0;
LAB_0015cc3a:
          uVar25 = uVar26 - 1 >> 1 | uVar26 - 1;
          uVar25 = uVar25 >> 2 | uVar25;
          uVar25 = uVar25 >> 4 | uVar25;
          uVar25 = uVar25 >> 8 | uVar25;
          if ((int)((uVar25 >> 0x10 | uVar25) + 1) < iVar20) {
            if (uVar26 != 0xffffffff) goto LAB_0015cc6e;
            sVar54 = 0;
            goto LAB_0015cca2;
          }
        }
        else {
          if (uVar26 != 0) {
            uVar25 = (uint)((ulong)local_4218 >> 1) | uVar26;
            uVar25 = uVar25 >> 2 | uVar25;
            uVar25 = uVar25 >> 4 | uVar25;
            uVar25 = uVar25 >> 8 | uVar25;
            iVar20 = (uVar25 >> 0x10 | uVar25) + 1;
            goto LAB_0015cc3a;
          }
LAB_0015cc6e:
          uVar25 = (uint)((ulong)local_4218 >> 1) | uVar26;
          uVar25 = uVar25 >> 2 | uVar25;
          uVar25 = uVar25 >> 4 | uVar25;
          uVar25 = uVar25 >> 8 | uVar25;
          sVar54 = (long)(int)((uVar25 >> 0x10 | uVar25) + 1) * 0xc;
LAB_0015cca2:
          pos = (yo__vec3f *)realloc(pos,sVar54);
        }
        pos[(int)uVar26].x = (float)dVar13;
        pos[(int)uVar26].y = (float)dVar14;
        pos[(int)uVar26].z = (float)dVar15;
        local_4218 = (yo_texture *)(ulong)(uVar26 + 1);
        goto LAB_0015ca76;
      case 'x':
        if (*(char *)((long)local_2038 + 1) == 'f') {
LAB_0015c915:
          cVar5 = *(char *)((long)local_2038 + 2);
          goto joined_r0x0015c919;
        }
        break;
      default:
        if (*(char *)local_2038 == '#') goto LAB_0015ca76;
      }
      iVar20 = strcmp((char *)local_2038,"usemtl");
      if (iVar20 == 0) {
        pyVar29 = yo__flush_shape(scene_00,vhash);
        pcVar30 = apcStack_2030[0];
        if (apcStack_2030[0] == (char *)0x0 || (int)uVar25 < 2) {
          pcVar31 = (char *)0x0;
        }
        else {
          sVar54 = strlen(apcStack_2030[0]);
          pcVar31 = (char *)calloc(sVar54 + 1,1);
          strcpy(pcVar31,pcVar30);
        }
        pyVar29->matname = pcVar31;
      }
      else {
        iVar20 = strcmp(pcVar30,"mtllib");
        if (iVar20 == 0) {
          pcVar30 = (char *)0x0;
          for (pcVar31 = "../res/scene1/scene1.obj";
              ((cVar5 = *pcVar31, pcVar48 = pcVar31, cVar5 == '/' || (cVar5 == '\\')) ||
              (pcVar48 = pcVar30, cVar5 != '\0')); pcVar31 = pcVar31 + 1) {
            pcVar30 = pcVar48;
          }
          pppcVar32 = &local_3038;
          if (pcVar30 != (char *)0x0) {
            strncpy((char *)&local_3038,"../res/scene1/scene1.obj",(size_t)(pcVar30 + -0x1949af));
            pppcVar32 = (char ***)(&stack0xffffffffffe68619 + (long)pcVar30);
          }
          *(char *)pppcVar32 = '\0';
          strcat((char *)&local_3038,apcStack_2030[0]);
          pyVar33 = yo__load_mtl(scene_00,(char *)&local_3038);
          if (pyVar33 == (yo_scene *)0x0) {
            initScene();
          }
          pyVar33 = yo__load_mtl(scene_00,(char *)&local_3038);
          if (pyVar33 == (yo_scene *)0x0) goto LAB_0015e358;
        }
      }
LAB_0015ca76:
      pcVar30 = fgets((char *)&local_4038,0x1000,__stream);
    } while (pcVar30 != (char *)0x0);
  }
  yo__flush_shape(scene_00,vhash);
  scene_00->nshapes = scene_00->nshapes + -1;
  fclose(__stream);
  iVar20 = scene_00->nshapes;
  if (0 < (long)iVar20) {
    pyVar29 = scene_00->shapes;
    lVar34 = 0;
    do {
      pyVar29[lVar34].matid = -1;
      local_41d8._0_8_ = lVar34 * 0x60;
      pbVar7 = (byte *)pyVar29[lVar34].matname;
      if ((pbVar7 != (byte *)0x0) && (iVar53 = scene_00->nmaterials, 0 < (long)iVar53)) {
        local_41d8._0_8_ = pyVar29 + lVar34;
        iVar24 = -1;
        lVar58 = 0;
        do {
          if (-1 < iVar24) break;
          pbVar49 = (byte *)scene_00->materials[lVar58].name;
          bVar55 = *pbVar49;
          pbVar61 = pbVar7;
          if (bVar55 == 0) {
            uVar25 = 0;
          }
          else {
            do {
              pbVar49 = pbVar49 + 1;
              iVar22 = tolower((int)(char)bVar55);
              iVar23 = tolower((int)(char)*pbVar61);
              if (iVar22 != iVar23) goto LAB_0015cfd1;
              pbVar61 = pbVar61 + 1;
              bVar55 = *pbVar49;
            } while (bVar55 != 0);
            bVar55 = 0;
LAB_0015cfd1:
            uVar25 = (uint)bVar55;
          }
          iVar22 = tolower(uVar25);
          iVar23 = tolower((uint)*pbVar61);
          if (iVar22 == iVar23) {
            iVar24 = (int)lVar58;
            pyVar29[lVar34].matid = iVar24;
          }
          lVar58 = lVar58 + 1;
        } while (lVar58 != iVar53);
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != iVar20);
  }
  iVar20 = scene_00->nenvs;
  if (0 < (long)iVar20) {
    pyVar8 = scene_00->envs;
    lVar34 = 0;
    do {
      pyVar8[lVar34].matid = -1;
      local_41d8._0_8_ = lVar34 * 0x38;
      pbVar7 = (byte *)pyVar8[lVar34].matname;
      if ((pbVar7 != (byte *)0x0) && (iVar53 = scene_00->nmaterials, 0 < (long)iVar53)) {
        local_41d8._0_8_ = pyVar8 + lVar34;
        uVar50 = 0xffffffff;
        uVar59 = 0;
        do {
          if (-1 < (int)uVar50) break;
          pbVar49 = (byte *)scene_00->materials[uVar59].name;
          bVar55 = *pbVar49;
          pbVar61 = pbVar7;
          if (bVar55 == 0) {
            uVar25 = 0;
          }
          else {
            do {
              pbVar49 = pbVar49 + 1;
              iVar24 = tolower((int)(char)bVar55);
              iVar22 = tolower((int)(char)*pbVar61);
              if (iVar24 != iVar22) goto LAB_0015d0ff;
              pbVar61 = pbVar61 + 1;
              bVar55 = *pbVar49;
            } while (bVar55 != 0);
            bVar55 = 0;
LAB_0015d0ff:
            uVar25 = (uint)bVar55;
          }
          iVar24 = tolower(uVar25);
          iVar22 = tolower((uint)*pbVar61);
          if (iVar24 == iVar22) {
            pyVar8[lVar34].matid = (int)uVar59;
            uVar50 = uVar59 & 0xffffffff;
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 != (long)iVar53);
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 != iVar20);
  }
  scene_00->ntextures = 0;
  scene_00->textures = (yo_texture *)0x0;
  if (0 < scene_00->nmaterials) {
    local_4218 = (yo_texture *)0x0;
    lVar34 = 0;
    do {
      pyVar36 = scene_00->materials;
      local_3038 = (char **)pyVar36[lVar34].ke_txt;
      pcStack_3030 = pyVar36[lVar34].ka_txt;
      local_3028 = pyVar36[lVar34].kd_txt;
      pcStack_3020 = pyVar36[lVar34].ks_txt;
      local_3018 = pyVar36[lVar34].kr_txt;
      pcStack_3010 = pyVar36[lVar34].kt_txt;
      local_3008 = pyVar36[lVar34].ns_txt;
      local_3000 = pyVar36[lVar34].op_txt;
      local_2ff8 = pyVar36[lVar34].op_txt;
      local_2ff0 = pyVar36[lVar34].ior_txt;
      pcStack_2fe8 = pyVar36[lVar34].bump_txt;
      local_2fe0 = pyVar36[lVar34].disp_txt;
      local_40c8._M_dataplus._M_p = (pointer)&pyVar36[lVar34].ke_txtid;
      local_40c8._M_string_length = (size_type)&pyVar36[lVar34].ka_txtid;
      local_40c8.field_2._M_allocated_capacity = (size_type)&pyVar36[lVar34].kd_txtid;
      local_40c8.field_2._8_8_ = &pyVar36[lVar34].ks_txtid;
      local_40a8 = &pyVar36[lVar34].kr_txtid;
      local_40a0 = &pyVar36[lVar34].kt_txtid;
      local_4098 = &pyVar36[lVar34].ns_txtid;
      local_4090 = &pyVar36[lVar34].op_txtid;
      local_4088 = &pyVar36[lVar34].op_txtid;
      local_4080 = &pyVar36[lVar34].ior_txtid;
      local_4078 = &pyVar36[lVar34].bump_txtid;
      local_4070 = &pyVar36[lVar34].disp_txtid;
      lVar58 = 0;
      do {
        ppcVar45 = (&local_3038)[lVar58];
        if (ppcVar45 == (char **)0x0) {
          uVar25 = 0xffffffff;
        }
        else {
          uVar26 = scene_00->ntextures;
          if (0 < (long)(int)uVar26) {
            uVar25 = 0xffffffff;
            uVar50 = 1;
            pyVar37 = local_4218;
            do {
              iVar20 = strcmp((char *)ppcVar45,pyVar37->path);
              uVar47 = (int)uVar50 - 1;
              if (iVar20 != 0) {
                uVar47 = uVar25;
              }
              uVar25 = uVar47;
              if ((ulong)(long)(int)uVar26 <= uVar50) break;
              uVar50 = uVar50 + 1;
              pyVar37 = pyVar37 + 1;
            } while ((int)uVar25 < 0);
            if (-1 < (int)uVar25) goto LAB_0015d442;
          }
          if (uVar26 == 0xffffffff) {
            iVar20 = 0;
LAB_0015d340:
            uVar47 = uVar26 - 1 >> 1 | uVar26 - 1;
            uVar47 = uVar47 >> 2 | uVar47;
            uVar47 = uVar47 >> 4 | uVar47;
            uVar47 = uVar47 >> 8 | uVar47;
            uVar25 = uVar26;
            if ((int)((uVar47 >> 0x10 | uVar47) + 1) < iVar20) {
              if (uVar26 != 0xffffffff) goto LAB_0015d374;
              sVar54 = 0;
              goto LAB_0015d39f;
            }
          }
          else {
            if (uVar26 != 0) {
              uVar25 = uVar26 >> 1 | uVar26;
              uVar25 = uVar25 >> 2 | uVar25;
              uVar25 = uVar25 >> 4 | uVar25;
              uVar25 = uVar25 >> 8 | uVar25;
              iVar20 = (uVar25 >> 0x10 | uVar25) + 1;
              goto LAB_0015d340;
            }
LAB_0015d374:
            uVar26 = uVar26 >> 1 | uVar26;
            uVar26 = uVar26 >> 2 | uVar26;
            uVar26 = uVar26 >> 4 | uVar26;
            uVar26 = uVar26 >> 8 | uVar26;
            sVar54 = (long)(int)((uVar26 >> 0x10 | uVar26) + 1) << 5;
LAB_0015d39f:
            local_4218 = (yo_texture *)realloc(local_4218,sVar54);
            scene_00->textures = local_4218;
            uVar25 = scene_00->ntextures;
            if ((long)(int)uVar25 == -1) {
              iVar20 = 0;
            }
            else {
              uVar26 = uVar25 >> 1 | uVar25;
              uVar26 = uVar26 >> 2 | uVar26;
              uVar26 = uVar26 >> 4 | uVar26;
              uVar26 = uVar26 >> 8 | uVar26;
              iVar20 = (uVar26 >> 0x10 | uVar26) + 1;
            }
            memset(local_4218 + (int)uVar25,0,(long)(int)(iVar20 - uVar25) << 5);
          }
          scene_00->ntextures = uVar25 + 1;
          sVar54 = strlen((char *)ppcVar45);
          pcVar30 = (char *)calloc(sVar54 + 1,1);
          strcpy(pcVar30,(char *)ppcVar45);
          local_4218[(int)uVar25].path = pcVar30;
        }
LAB_0015d442:
        *(uint *)(&local_40c8._M_dataplus)[lVar58]._M_p = uVar25;
        lVar58 = lVar58 + 1;
      } while (lVar58 != 0xc);
      lVar34 = lVar34 + 1;
    } while (lVar34 < scene_00->nmaterials);
  }
  lVar34 = 0x80001;
  do {
    if (*(void **)(vhash->s + lVar34 * 2 + -1) != (void *)0x0) {
      free(*(void **)(vhash->s + lVar34 * 2 + -1));
    }
    lVar34 = lVar34 + 1;
  } while (lVar34 != 0x180001);
  free(vhash);
  if (pos != (yo__vec3f *)0x0) {
    free(pos);
  }
  if (local_41e8 != (yo__vec3f *)0x0) {
    free(local_41e8);
  }
  if (local_41e0 != (yo__vec2f *)0x0) {
    free(local_41e0);
  }
  if (scene_00->cameras != (yo_camera *)0x0) {
    pyVar35 = (yo_camera *)realloc(scene_00->cameras,(long)scene_00->ncameras * 0x38);
    scene_00->cameras = pyVar35;
  }
  if (scene_00->shapes != (yo_shape *)0x0) {
    pyVar29 = (yo_shape *)realloc(scene_00->shapes,(long)scene_00->nshapes * 0x60);
    scene_00->shapes = pyVar29;
  }
  if (scene_00->materials != (yo_material *)0x0) {
    pyVar36 = (yo_material *)realloc(scene_00->materials,(long)scene_00->nmaterials * 0xe8);
    scene_00->materials = pyVar36;
  }
  if (scene_00->textures != (yo_texture *)0x0) {
    pyVar37 = (yo_texture *)realloc(scene_00->textures,(long)scene_00->ntextures << 5);
    scene_00->textures = pyVar37;
  }
  if (scene_00->nshapes == 0) goto LAB_0015e358;
  github111116::ConsoleLogger::log<int,char[7]>(&console,(int *)scene_00,(char (*) [7])"shapes");
  (scene->mesh).vertices = 0;
  iVar20 = scene_00->nshapes;
  if (0 < (long)iVar20) {
    lVar34 = 0;
    iVar53 = 0;
    do {
      iVar53 = iVar53 + *(int *)((long)&scene_00->shapes->nelems + lVar34) * 3;
      lVar34 = lVar34 + 0x60;
    } while ((long)iVar20 * 0x60 != lVar34);
    (scene->mesh).vertices = iVar53;
  }
  upload_albedo_map(iVar20,texture_file_abi_cxx11_);
  sVar54 = (size_t)(scene->mesh).vertices;
  positions = (vec3f *)calloc(sVar54,0xc);
  pvVar38 = calloc(sVar54,8);
  normal = (vec3f *)calloc(sVar54,0xc);
  __src = calloc(sVar54,4);
  piVar39 = (int *)calloc(sVar54,4);
  sphcnt = (int *)calloc(sVar54,4);
  LHbuffer = (float *)calloc(sVar54,900);
  local_2038 = (char **)((ulong)local_2038._4_4_ << 0x20);
  iVar20 = scene_00->nshapes;
  if (0 < iVar20) {
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_41d8._8_8_;
    local_41d8 = auVar17 << 0x40;
    iVar53 = 0;
    do {
      auVar16 = local_41d8;
      pyVar29 = scene_00->shapes;
      iVar20 = iVar53;
      if ((enable_texture[iVar53] == true) && (pyVar29[iVar53].texcoord == (float *)0x0)) {
        github111116::ConsoleLogger::error<char[6],int,char[39]>
                  (&console,(char (*) [6])"Shape",(int *)&local_2038,
                   (char (*) [39])"is texture-enabled but has no texcoord");
        iVar20 = (int)local_2038;
      }
      uVar25 = pyVar29[iVar53].nelems * 3;
      if (0 < pyVar29[iVar53].nelems) {
        piVar9 = pyVar29[iVar53].elem;
        pfVar10 = pyVar29[iVar53].pos;
        pfVar11 = pyVar29[iVar53].norm;
        bVar6 = enable_texture[iVar20];
        lVar34 = (long)(int)local_41d8._0_4_;
        uVar50 = 1;
        if (1 < (int)uVar25) {
          uVar50 = (ulong)uVar25;
        }
        lVar58 = lVar34 * 0xc;
        lVar51 = 0;
        do {
          lVar42 = (long)*(int *)((long)piVar9 + lVar51);
          *(float *)((long)&positions->z + lVar58) = pfVar10[lVar42 * 3 + 2];
          *(undefined8 *)((long)&positions->x + lVar58) = *(undefined8 *)(pfVar10 + lVar42 * 3);
          *(float *)((long)&normal->z + lVar58) = pfVar11[lVar42 * 3 + 2];
          *(undefined8 *)((long)&normal->x + lVar58) = *(undefined8 *)(pfVar11 + lVar42 * 3);
          if (bVar6 == false) {
            *(undefined8 *)((long)pvVar38 + lVar51 * 2 + lVar34 * 8) = 0xbf800000bf800000;
          }
          else {
            *(undefined8 *)((long)pvVar38 + lVar51 * 2 + lVar34 * 8) =
                 *(undefined8 *)(pyVar29[iVar53].texcoord + lVar42 * 2);
          }
          *(int *)((long)__src + lVar51 + lVar34 * 4) = iVar20;
          lVar58 = lVar58 + 0xc;
          lVar51 = lVar51 + 4;
        } while (uVar50 * 4 != lVar51);
      }
      local_41d8._4_4_ = 0;
      local_41d8._0_4_ = local_41d8._0_4_ + uVar25;
      local_41d8._8_8_ = auVar16._8_8_;
      iVar53 = iVar20 + 1;
      local_2038 = (char **)CONCAT44(local_2038._4_4_,iVar53);
      iVar20 = scene_00->nshapes;
    } while (iVar53 < iVar20);
  }
  iVar53 = scene_00->ncameras;
  if (0 < iVar53) {
    lVar58 = 0;
    lVar34 = 0;
    do {
      pvVar40 = *(void **)((long)scene_00->cameras->from + lVar58 + -8);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
        iVar53 = scene_00->ncameras;
      }
      lVar34 = lVar34 + 1;
      lVar58 = lVar58 + 0x38;
    } while (lVar34 < iVar53);
    iVar20 = scene_00->nshapes;
  }
  if (0 < iVar20) {
    lVar58 = 0x40;
    lVar34 = 0;
    do {
      pyVar29 = scene_00->shapes;
      pvVar40 = *(void **)((long)pyVar29 + lVar58 + -0x40);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)pyVar29 + lVar58 + -0x30);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)pyVar29 + lVar58 + -0x20);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)pyVar29 + lVar58 + -0x10);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)pyVar29 + lVar58 + -8);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)&pyVar29->name + lVar58);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      lVar34 = lVar34 + 1;
      lVar58 = lVar58 + 0x60;
    } while (lVar34 < scene_00->nshapes);
  }
  if (0 < scene_00->nmaterials) {
    lVar34 = 0;
    do {
      pyVar36 = scene_00->materials;
      if (pyVar36[lVar34].name != (char *)0x0) {
        free(pyVar36[lVar34].name);
      }
      local_2038 = (char **)pyVar36[lVar34].ke_txt;
      apcStack_2030[0] = pyVar36[lVar34].ka_txt;
      apcStack_2030[1] = pyVar36[lVar34].kd_txt;
      apcStack_2030[2] = pyVar36[lVar34].ks_txt;
      apcStack_2030[3] = pyVar36[lVar34].kr_txt;
      pcStack_2010 = pyVar36[lVar34].kt_txt;
      local_2008 = pyVar36[lVar34].ns_txt;
      pcStack_2000 = pyVar36[lVar34].op_txt;
      local_1ff8 = pyVar36[lVar34].bump_txt;
      pcStack_1ff0 = pyVar36[lVar34].disp_txt;
      lVar58 = 0;
      do {
        if ((void *)(&local_2038)[lVar58] != (void *)0x0) {
          free((void *)(&local_2038)[lVar58]);
        }
        lVar58 = lVar58 + 1;
      } while (lVar58 != 10);
      lVar34 = lVar34 + 1;
    } while (lVar34 < scene_00->nmaterials);
  }
  if (0 < scene_00->nenvs) {
    lVar58 = 8;
    lVar34 = 0;
    do {
      pyVar8 = scene_00->envs;
      pvVar40 = *(void **)((long)pyVar8->from + lVar58 + -0x1c);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)pyVar8->from + lVar58 + -0x14);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      lVar34 = lVar34 + 1;
      lVar58 = lVar58 + 0x38;
    } while (lVar34 < scene_00->nenvs);
  }
  if (0 < scene_00->ntextures) {
    lVar58 = 0;
    lVar34 = 0;
    do {
      pyVar37 = scene_00->textures;
      pvVar40 = *(void **)((long)&pyVar37->path + lVar58);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      pvVar40 = *(void **)((long)&pyVar37->pixels + lVar58);
      if (pvVar40 != (void *)0x0) {
        free(pvVar40);
      }
      lVar34 = lVar34 + 1;
      lVar58 = lVar58 + 0x20;
    } while (lVar34 < scene_00->ntextures);
  }
  cluster_points((scene->mesh).vertices,positions,piVar39);
  cluster_preprocess((scene->mesh).vertices,positions,piVar39,&local_4060,sphcnt);
  calculateLH((scene->mesh).vertices,positions,normal,LHbuffer,"../res/scene1/light7.obj");
  uploadLH((scene->mesh).vertices,LHbuffer);
  github111116::ConsoleLogger::log<char[25]>(&console,(char (*) [25])"renderer initializing...");
  pGVar1 = &(scene->mesh).vao;
  (*glad_glGenVertexArrays)(1,pGVar1);
  (*glad_glBindVertexArray)(*pGVar1);
  pGVar1 = &(scene->mesh).vbo;
  (*glad_glGenBuffers)(1,pGVar1);
  (*glad_glBindBuffer)(0x8892,*pGVar1);
  (*glad_glBufferData)(0x8892,sVar54 * 0x2c,(void *)0x0,0x88e4);
  pvVar40 = (*glad_glMapBuffer)(0x8892,0x88b9);
  if (pvVar40 == (void *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/main.cpp"
                  ,0xbd,"void initScene(scene_t *)");
  }
  __n = sVar54 * 4;
  __n_00 = (void *)(sVar54 * 0xc);
  memcpy(pvVar40,positions,(size_t)__n_00);
  memcpy((void *)((long)pvVar40 + (long)__n_00),pvVar38,sVar54 * 8);
  pvVar38 = (void *)((long)pvVar40 + (long)__n_00 + sVar54 * 8);
  memcpy(pvVar38,normal,(size_t)__n_00);
  pvVar38 = (void *)((long)pvVar38 + (long)__n_00);
  memcpy(pvVar38,__src,__n);
  pvVar38 = (void *)((long)pvVar38 + __n);
  memcpy(pvVar38,piVar39,__n);
  memcpy((void *)((long)pvVar38 + __n),sphcnt,__n);
  (*glad_glUnmapBuffer)(0x8892);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,3,0x1406,'\0',0,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0,__n_00);
  (*glad_glEnableVertexAttribArray)(2);
  (*glad_glVertexAttribPointer)(2,3,0x1406,'\0',0,(void *)(sVar54 * 0x14));
  (*glad_glEnableVertexAttribArray)(3);
  (*glad_glVertexAttribIPointer)(3,1,0x1404,0,(void *)(sVar54 << 5));
  (*glad_glEnableVertexAttribArray)(4);
  (*glad_glVertexAttribIPointer)(4,1,0x1404,0,(void *)(sVar54 * 0x24));
  (*glad_glEnableVertexAttribArray)(5);
  (*glad_glVertexAttribIPointer)(5,1,0x1404,0,(void *)(sVar54 * 0x28));
  free(positions);
  free(normal);
  free(__src);
  free(piVar39);
  free(sphcnt);
  free(LHbuffer);
  local_2038 = apcStack_2030 + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2038,"0","");
  iVar20 = 0xe0;
  do {
    local_4038 = &local_4028;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4038,local_2038,apcStack_2030[0] + (long)local_2038);
    std::__cxx11::string::append((char *)&local_4038);
    std::__cxx11::string::operator=((string *)&local_2038,(string *)&local_4038);
    if (local_4038 != &local_4028) {
      operator_delete(local_4038);
    }
    iVar20 = iVar20 + -1;
  } while (iVar20 != 0);
  local_4168 = &uStack_4158;
  std::__cxx11::string::_M_construct((ulong)&local_4168,'\x02');
  *(undefined2 *)local_4168 = 0x3531;
  plVar41 = (long *)std::__cxx11::string::replace((ulong)&local_4168,0,(char *)0x0,0x199294);
  local_4108._0_8_ = &local_4108.radius;
  plVar43 = plVar41 + 2;
  if ((long *)*plVar41 == plVar43) {
    local_4108._16_8_ = *plVar43;
    lStack_40f0 = plVar41[3];
  }
  else {
    local_4108._16_8_ = *plVar43;
    local_4108._0_8_ = (long *)*plVar41;
  }
  local_4108._8_8_ = plVar41[1];
  *plVar41 = (long)plVar43;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  plVar41 = (long *)std::__cxx11::string::append((char *)&local_4108);
  plVar43 = plVar41 + 2;
  if ((long *)*plVar41 == plVar43) {
    lStack_4190 = plVar41[3];
    uStack_4198 = (undefined4)*plVar43;
    uStack_4194 = (undefined4)((ulong)*plVar43 >> 0x20);
    local_41a8 = &uStack_4198;
  }
  else {
    uStack_4198 = (undefined4)*plVar43;
    uStack_4194 = (undefined4)((ulong)*plVar43 >> 0x20);
    local_41a8 = (undefined4 *)*plVar41;
  }
  uStack_41a0 = (uint)plVar41[1];
  uStack_419c = (undefined4)((ulong)plVar41[1] >> 0x20);
  *plVar41 = (long)plVar43;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  local_40e8 = local_40d8;
  std::__cxx11::string::_M_construct((ulong)&local_40e8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40e8,3,0xe1);
  uVar50 = local_40e0 + CONCAT44(uStack_419c,uStack_41a0);
  uVar59 = 0xf;
  if (local_41a8 != &uStack_4198) {
    uVar59 = CONCAT44(uStack_4194,uStack_4198);
  }
  if (uVar59 < uVar50) {
    uVar59 = 0xf;
    if (local_40e8 != local_40d8) {
      uVar59 = local_40d8[0];
    }
    if (uVar50 <= uVar59) {
      puVar57 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_40e8,0,(char *)0x0,(ulong)local_41a8);
      goto LAB_0015decd;
    }
  }
  puVar57 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_41a8,(ulong)local_40e8);
LAB_0015decd:
  local_4188[0] = &((yo__vert *)local_4188)->radius;
  puVar2 = puVar57 + 2;
  if ((int *)*puVar57 == (int *)puVar2) {
    _local_4178 = *puVar2;
    uStack_4170 = puVar57[3];
  }
  else {
    _local_4178 = *puVar2;
    local_4188[0] = (int *)*puVar57;
  }
  local_4188[1] = (int *)puVar57[1];
  *puVar57 = puVar2;
  puVar57[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar41 = (long *)std::__cxx11::string::append((char *)local_4188);
  plVar43 = plVar41 + 2;
  if ((long *)*plVar41 == plVar43) {
    lStack_4110 = plVar41[3];
    uStack_4118 = (undefined4)*plVar43;
    uStack_4114 = (undefined4)((ulong)*plVar43 >> 0x20);
    local_4128 = &uStack_4118;
  }
  else {
    uStack_4118 = (undefined4)*plVar43;
    uStack_4114 = (undefined4)((ulong)*plVar43 >> 0x20);
    local_4128 = (undefined4 *)*plVar41;
  }
  uStack_4120 = (uint)plVar41[1];
  uStack_411c = (undefined4)((ulong)plVar41[1] >> 0x20);
  *plVar41 = (long)plVar43;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  plVar41 = (long *)std::__cxx11::string::_M_append((char *)&local_4128,(ulong)local_2038);
  paVar3 = &local_4148.field_2;
  psVar44 = (size_type *)(plVar41 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar41 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar44) {
    local_4148.field_2._M_allocated_capacity = *psVar44;
    local_4148.field_2._8_8_ = plVar41[3];
    local_4148._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_4148.field_2._M_allocated_capacity = *psVar44;
    local_4148._M_dataplus._M_p = (pointer)*plVar41;
  }
  local_4148._M_string_length = plVar41[1];
  *plVar41 = (long)psVar44;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  plVar41 = (long *)std::__cxx11::string::append((char *)&local_4148);
  paVar4 = &local_40c8.field_2;
  psVar44 = (size_type *)(plVar41 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar41 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar44) {
    local_40c8.field_2._M_allocated_capacity = *psVar44;
    local_40c8.field_2._8_8_ = plVar41[3];
    local_40c8._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_40c8.field_2._M_allocated_capacity = *psVar44;
    local_40c8._M_dataplus._M_p = (pointer)*plVar41;
  }
  local_40c8._M_string_length = plVar41[1];
  *plVar41 = (long)psVar44;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  plVar41 = (long *)std::__cxx11::string::append((char *)&local_40c8);
  ppcVar45 = (char **)(plVar41 + 2);
  if ((char **)*plVar41 == ppcVar45) {
    local_3028 = *ppcVar45;
    pcStack_3020 = (char *)plVar41[3];
    local_3038 = &local_3028;
  }
  else {
    local_3028 = *ppcVar45;
    local_3038 = (char **)*plVar41;
  }
  pcStack_3030 = (char *)plVar41[1];
  *plVar41 = (long)ppcVar45;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  plVar41 = (long *)std::__cxx11::string::append((char *)&local_3038);
  plVar43 = plVar41 + 2;
  if ((long *)*plVar41 == plVar43) {
    local_4028 = *plVar43;
    lStack_4020 = plVar41[3];
    local_4038 = &local_4028;
  }
  else {
    local_4028 = *plVar43;
    local_4038 = (long *)*plVar41;
  }
  local_4030 = plVar41[1];
  *plVar41 = (long)plVar43;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  if (local_3038 != &local_3028) {
    operator_delete(local_3038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_40c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4148._M_dataplus._M_p != paVar3) {
    operator_delete(local_4148._M_dataplus._M_p);
  }
  if (local_4128 != &uStack_4118) {
    operator_delete(local_4128);
  }
  if (local_4188[0] != &((yo__vert *)local_4188)->radius) {
    operator_delete(local_4188[0]);
  }
  if (local_40e8 != local_40d8) {
    operator_delete(local_40e8);
  }
  if (local_41a8 != &uStack_4198) {
    operator_delete(local_41a8);
  }
  if ((int *)local_4108._0_8_ != &local_4108.radius) {
    operator_delete((void *)local_4108._0_8_);
  }
  if (local_4168 != &uStack_4158) {
    operator_delete(local_4168);
  }
  readfile_abi_cxx11_(&local_40c8,"../shaders/vert.glsl");
  plVar41 = (long *)std::__cxx11::string::replace
                              ((ulong)&local_40c8,0,(char *)0x0,(ulong)local_4038);
  ppcVar45 = (char **)(plVar41 + 2);
  if ((char **)*plVar41 == ppcVar45) {
    local_3028 = *ppcVar45;
    pcStack_3020 = (char *)plVar41[3];
    local_3038 = &local_3028;
  }
  else {
    local_3028 = *ppcVar45;
    local_3038 = (char **)*plVar41;
  }
  vp = local_3038;
  pcStack_3030 = (char *)plVar41[1];
  *plVar41 = (long)ppcVar45;
  plVar41[1] = 0;
  *(undefined1 *)(plVar41 + 2) = 0;
  readfile_abi_cxx11_(&local_4148,"../shaders/frag.glsl");
  GVar27 = s_loadProgram((char *)vp,local_4148._M_dataplus._M_p,&PTR_anon_var_dwarf_3bb59_001b6ab0,6
                        );
  (scene->mesh).program = GVar27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4148._M_dataplus._M_p != paVar3) {
    operator_delete(local_4148._M_dataplus._M_p);
  }
  if (local_3038 != &local_3028) {
    operator_delete(local_3038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_40c8._M_dataplus._M_p);
  }
  GVar27 = (scene->mesh).program;
  if (GVar27 != 0) {
    GVar28 = (*glad_glGetUniformLocation)(GVar27,"u_view");
    (scene->mesh).u_view = GVar28;
    GVar28 = (*glad_glGetUniformLocation)((scene->mesh).program,"u_projection");
    (scene->mesh).u_projection = GVar28;
    if (local_4038 != &local_4028) {
      operator_delete(local_4038);
    }
    if (local_2038 != apcStack_2030 + 1) {
      operator_delete(local_2038);
    }
    std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_4060.child);
    return;
  }
  puVar57 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar57 = "Error loading mesh shader";
  __cxa_throw(puVar57,&char_const*::typeinfo,0);
}

Assistant:

static void initScene(scene_t *scene)
{
	SphereTree hierarchy = load_sphere_hierarchy(sphere_file);
	buildLHcubemap(sh_light_file);
	loadlut(3, scene->mesh.max_magn);
	build_sh_lut();
	scene->mesh.gammasize = upload_gamma(shorder);
	scene->mesh.sqrgammasize = upload_sqrgamma(shorder);
	console.log("gamma size:", scene->mesh.gammasize);
	console.log("sqrgamma size:", scene->mesh.sqrgammasize);

	// mesh
	console.log("loading scene...");
	yo_scene *yo = yo_load_obj(obj_file, true, false);
	if (!yo || !yo->nshapes)
		throw "Error loading obj file";
	console.log(yo->nshapes, "shapes");

	scene->mesh.vertices = 0;
	for (int i = 0; i < yo->nshapes; i++)
		scene->mesh.vertices += yo->shapes[i].nelems * 3;

	// load model texture
	upload_albedo_map(yo->nshapes, texture_file);

	// alloc host space for attributes
	m_vec3 *positions = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	m_vec2 *texcoords = (m_vec2*)calloc(scene->mesh.vertices, sizeof(m_vec2));
	m_vec3 *normals   = (m_vec3*)calloc(scene->mesh.vertices, sizeof(m_vec3));
	int *objids       = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *clusterids   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	int *sphcnt   = (int*)calloc(scene->mesh.vertices, sizeof(int));
	// Note: LH isn't uploaded as vertex attribute
	float *LH = (float*)calloc(scene->mesh.vertices, N_COEFFS * sizeof(float));
	// total size of each attribute
	size_t positionsSize  = scene->mesh.vertices * sizeof(m_vec3);
	size_t texcoordsSize  = scene->mesh.vertices * sizeof(m_vec2);
	size_t normalsSize    = scene->mesh.vertices * sizeof(m_vec3);
	size_t objidsSize     = scene->mesh.vertices * sizeof(int);
	size_t clusteridsSize = scene->mesh.vertices * sizeof(int);
	size_t sphcntSize     = scene->mesh.vertices * sizeof(int);
	size_t LHSize         = scene->mesh.vertices * N_COEFFS * sizeof(float);

	// fill positions & normals from scene
	int n = 0;
	for (int i = 0; i < yo->nshapes; i++)
	{
		yo_shape *shape = yo->shapes + i;
		if (enable_texture[i] && !shape->texcoord)
			console.error("Shape",i,"is texture-enabled but has no texcoord");
		for (int j = 0; j < shape->nelems * 3; j++)
		{
			positions[n + j] = *(m_vec3*)&shape->pos[shape->elem[j] * 3];
			normals[n + j] = *(m_vec3*)&shape->norm[shape->elem[j] * 3];
			if (enable_texture[i])
				texcoords[n + j] = *(m_vec2*)&shape->texcoord[shape->elem[j] * 2];
			else
				texcoords[n + j] = m_vec2{-1,-1};
			objids[n + j] = i;
		}
		n += shape->nelems * 3;
	}
	yo_free_scene(yo);
	// cluster receiver
	cluster_points(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids);
	cluster_preprocess(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), clusterids, hierarchy, sphcnt);
	// preprocess lighting
	if (obj_light_enabled)
		calculateLH(scene->mesh.vertices, reinterpret_cast<vec3f*>(positions), reinterpret_cast<vec3f*>(normals), LH, obj_light_file);
	else
		memset(LH, 0, LHSize);
	// because openGL doesn't support array as attribute, we upload it as texture
	uploadLH(scene->mesh.vertices, LH);

	console.log("renderer initializing...");
	// upload geometry to opengl
	glGenVertexArrays(1, &scene->mesh.vao);
	glBindVertexArray(scene->mesh.vao);
	// upload attribute data
	glGenBuffers(1, &scene->mesh.vbo);
	glBindBuffer(GL_ARRAY_BUFFER, scene->mesh.vbo);
	glBufferData(GL_ARRAY_BUFFER, positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize + sphcntSize, NULL, GL_STATIC_DRAW);
	unsigned char *buffer = (unsigned char*)glMapBuffer(GL_ARRAY_BUFFER, GL_WRITE_ONLY);
	assert(buffer);
	memcpy(buffer, positions, positionsSize);
	memcpy(buffer + positionsSize, texcoords, texcoordsSize);
	memcpy(buffer + positionsSize + texcoordsSize, normals, normalsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize, objids, objidsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize, clusterids, clusteridsSize);
	memcpy(buffer + positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize, sphcnt, sphcntSize);
	glUnmapBuffer(GL_ARRAY_BUFFER);

	// set attribute pointers
	glEnableVertexAttribArray(0);
	glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 0, (void*)0);
	glEnableVertexAttribArray(1);
	glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, (void*)positionsSize);
	glEnableVertexAttribArray(2);
	glVertexAttribPointer(2, 3, GL_FLOAT, GL_FALSE, 0, (void*)(positionsSize + texcoordsSize));
	glEnableVertexAttribArray(3);
	glVertexAttribIPointer(3, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize));
	glEnableVertexAttribArray(4);
	glVertexAttribIPointer(4, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize));
	glEnableVertexAttribArray(5);
	glVertexAttribIPointer(5, 1, GL_INT, 0, (void*)(positionsSize + texcoordsSize + normalsSize + objidsSize + clusteridsSize));

	// free host space
	free(positions);
	free(normals);
	free(objids);
	free(clusterids);
	free(sphcnt);
	free(LH);

	const char *attribs[] =
	{
		"a_position",
		"a_texcoord",
		"a_normal",
		"a_objid",
		"a_clusterid",
		"a_sphcnt"
	};
	std::string N_ZEROS = "0";
	for (int i=1; i<N_COEFFS; ++i)
		N_ZEROS = N_ZEROS + ",0";
	std::string vert_head = "#version 410 core\n"
	"#define sh_order " + std::to_string(shorder) + "\n"
	"#define N " + std::to_string(shorder * shorder) + "\n"
	"#define N_ZEROS " + N_ZEROS + "\n"
	"#define SHEXP_METHOD " + SHEXP_METHOD + "\n";
	scene->mesh.program = s_loadProgram((vert_head + readfile(vert_shader_path)).c_str(), readfile(frag_shader_path).c_str(), attribs, 6);
	if (!scene->mesh.program)
		throw "Error loading mesh shader";
	scene->mesh.u_view = glGetUniformLocation(scene->mesh.program, "u_view");
	scene->mesh.u_projection = glGetUniformLocation(scene->mesh.program, "u_projection");
}